

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::WFXMLScanner::WFXMLScanner
          (WFXMLScanner *this,XMLValidator *valToAdopt,GrammarResolver *grammarResolver,
          MemoryManager *manager)

{
  CleanupType_conflict15 cleanup;
  JanitorMemFunCall<xercesc_4_0::WFXMLScanner> local_28;
  
  XMLScanner::XMLScanner(&this->super_XMLScanner,valToAdopt,grammarResolver,manager);
  (this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler =
       (_func_int **)&PTR__WFXMLScanner_00408f88;
  this->fElementIndex = 0;
  this->fElements = (RefVectorOf<xercesc_4_0::XMLElementDecl> *)0x0;
  this->fEntityTable = (ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0;
  this->fAttrNameHashList = (ValueVectorOf<unsigned_long> *)0x0;
  this->fAttrNSList = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)0x0;
  this->fElementLookup =
       (RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  local_28.fToCall = (MFPT)cleanUp;
  local_28._16_8_ = 0;
  local_28.fObject = this;
  commonInit(this);
  local_28.fObject = (WFXMLScanner *)0x0;
  JanitorMemFunCall<xercesc_4_0::WFXMLScanner>::~JanitorMemFunCall(&local_28);
  return;
}

Assistant:

WFXMLScanner::WFXMLScanner( XMLValidator* const  valToAdopt
                          , GrammarResolver* const grammarResolver
                          , MemoryManager* const manager) :

    XMLScanner(valToAdopt, grammarResolver, manager)
    , fElementIndex(0)
    , fElements(0)
    , fEntityTable(0)
    , fAttrNameHashList(0)
    , fAttrNSList(0)
    , fElementLookup(0)
{
    CleanupType cleanup(this, &WFXMLScanner::cleanUp);

    try
    {
        commonInit();
    }
    catch(const OutOfMemoryException&)
    {
        // Don't cleanup when out of memory, since executing the
        // code can cause problems.
        cleanup.release();

        throw;
    }

    cleanup.release();
}